

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O0

FabSet * __thiscall amrex::FabSet::copyFrom(FabSet *this,FabSet *src,int scomp,int dcomp,int ncomp)

{
  bool bVar1;
  BoxArray *pBVar2;
  int in_ECX;
  int in_EDX;
  FabSet *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dstfab;
  Array4<const_double> srcfab;
  Box *bx;
  FabSetIter fsi;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  FabSet *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  BoxArray *in_stack_fffffffffffffd80;
  int *piVar3;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd88;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd90;
  CpOp op;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_184 [7];
  int *local_168;
  MFIter local_160;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 local_e0;
  int local_d8;
  int *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  int *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_fc = in_R8D;
  local_f8 = in_ECX;
  local_f4 = in_EDX;
  pBVar2 = boxArray((FabSet *)0x10513df);
  op = (CpOp)pBVar2;
  boxArray((FabSet *)0x10513f1);
  bVar1 = BoxArray::operator==
                    (in_stack_fffffffffffffd80,
                     (BoxArray *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (bVar1) {
    in_stack_fffffffffffffd90 = (FabArray<amrex::FArrayBox> *)DistributionMap((FabSet *)0x1051411);
    DistributionMap((FabSet *)0x1051423);
    bVar1 = DistributionMapping::operator==
                      ((DistributionMapping *)in_stack_fffffffffffffd80,
                       (DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar1) {
      FabSetIter::FabSetIter
                ((FabSetIter *)in_stack_fffffffffffffd60,
                 (FabSet *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      while (bVar1 = MFIter::isValid(&local_160), bVar1) {
        piVar3 = local_184;
        MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        local_168 = piVar3;
        array(in_stack_fffffffffffffd60,
              (MFIter *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        array(in_stack_fffffffffffffd60,
              (MFIter *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        local_d0 = local_168;
        local_8 = local_168;
        local_c = 0;
        local_c4 = *local_168;
        local_18 = local_168;
        local_1c = 1;
        iStack_c0 = local_168[1];
        local_e0 = *(undefined8 *)local_168;
        local_28 = local_168;
        local_2c = 2;
        local_d8 = local_168[2];
        local_a8 = local_168;
        local_38 = local_168 + 3;
        local_3c = 0;
        local_9c = *local_38;
        local_48 = local_168 + 3;
        local_4c = 1;
        iStack_98 = local_168[4];
        local_b8 = *(undefined8 *)local_38;
        local_58 = local_168 + 3;
        local_5c = 2;
        local_b0 = local_168[5];
        for (local_24c = 0; local_250 = local_d8, local_24c < local_fc; local_24c = local_24c + 1) {
          for (; local_254 = iStack_c0, local_250 <= local_b0; local_250 = local_250 + 1) {
            for (; local_258 = local_c4, local_254 <= iStack_98; local_254 = local_254 + 1) {
              for (; local_258 <= local_9c; local_258 = local_258 + 1) {
                local_84 = local_258;
                local_88 = local_254;
                local_8c = local_250;
                local_90 = local_24c + local_f4;
                local_80 = &local_1c8;
                local_6c = local_258;
                local_70 = local_254;
                local_74 = local_250;
                local_78 = local_24c + local_f8;
                local_68 = &local_208;
                *(undefined8 *)
                 (local_208 +
                 ((long)(local_258 - local_1e8) + (local_254 - local_1e4) * local_200 +
                  (local_250 - local_1e0) * local_1f8 + local_78 * local_1f0) * 8) =
                     *(undefined8 *)
                      (local_1c8 +
                      ((long)(local_258 - local_1a8) + (local_254 - local_1a4) * local_1c0 +
                       (local_250 - local_1a0) * local_1b8 + local_90 * local_1b0) * 8);
              }
            }
          }
        }
        local_bc = local_d8;
        local_94 = local_b0;
        MFIter::operator++(&local_160);
      }
      FabSetIter::~FabSetIter((FabSetIter *)0x1051469);
      return in_RDI;
    }
  }
  Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(int)in_stack_fffffffffffffd80,local_fc
             ,(Periodicity *)CONCAT44(local_f4,in_stack_fffffffffffffd70),op);
  return in_RDI;
}

Assistant:

FabSet&
FabSet::copyFrom (const FabSet& src, int scomp, int dcomp, int ncomp)
{
    if (boxArray() == src.boxArray() && DistributionMap() == src.DistributionMap()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter fsi(*this); fsi.isValid(); ++fsi) {
            const Box& bx = fsi.validbox();
            auto const srcfab =   src.array(fsi);
            auto       dstfab = this->array(fsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dstfab(i,j,k,n+dcomp) = srcfab(i,j,k,n+scomp);
            });
        }
    } else {
        m_mf.ParallelCopy(src.m_mf,scomp,dcomp,ncomp);
    }
    return *this;
}